

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHelper.h
# Opt level: O0

void __thiscall
FIX::ExceptionMessageStoreFactory::ExceptionMessageStoreFactory
          (ExceptionMessageStoreFactory *this,SessionSettings *settings)

{
  SessionSettings *settings_local;
  ExceptionMessageStoreFactory *this_local;
  
  MessageStoreFactory::MessageStoreFactory(&this->super_MessageStoreFactory);
  (this->super_MessageStoreFactory)._vptr_MessageStoreFactory =
       (_func_int **)&PTR__ExceptionMessageStoreFactory_0050a710;
  std::__cxx11::string::string((string *)&this->m_path);
  SessionSettings::SessionSettings(&this->m_settings,settings);
  return;
}

Assistant:

ExceptionMessageStoreFactory(const SessionSettings &settings)
      : m_settings(settings) {}